

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O3

void test_square_brackets(void)

{
  bool bVar1;
  json *pjVar2;
  json o;
  json a;
  json jStack_118;
  json local_c0;
  json local_68;
  
  argo::json::json(&local_c0,array_e);
  argo::json::json(&jStack_118,10);
  argo::json::append(&local_c0,&jStack_118);
  argo::json::~json(&jStack_118);
  argo::json::json(&jStack_118,20.0);
  argo::json::append(&local_c0,&jStack_118);
  argo::json::~json(&jStack_118);
  argo::json::json(&jStack_118,"asdf");
  argo::json::append(&local_c0,&jStack_118);
  argo::json::~json(&jStack_118);
  argo::json::json(&jStack_118,true);
  argo::json::append(&local_c0,&jStack_118);
  argo::json::~json(&jStack_118);
  test_square_brackets_const_array(&local_c0);
  pjVar2 = argo::json::operator[](&local_c0,0);
  bVar1 = argo::json::operator!=(pjVar2,10);
  if (bVar1) {
LAB_0010fb31:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"FAIL: array access failed\n",0x1a);
  }
  else {
    pjVar2 = argo::json::operator[](&local_c0,1);
    bVar1 = argo::json::operator!=(pjVar2,20.0);
    if (bVar1) goto LAB_0010fb31;
    pjVar2 = argo::json::operator[](&local_c0,2);
    bVar1 = argo::json::operator!=(pjVar2,"asdf");
    if (bVar1) goto LAB_0010fb31;
    pjVar2 = argo::json::operator[](&local_c0,3);
    bVar1 = argo::json::operator_cast_to_bool(pjVar2);
    if (!bVar1) goto LAB_0010fb31;
  }
  argo::json::json(&jStack_118,object_e);
  pjVar2 = argo::json::operator[](&jStack_118,"a");
  argo::json::json(&local_68);
  bVar1 = argo::json::operator!=(pjVar2,&local_68);
  argo::json::~json(&local_68);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"FAIL: empty element isn\'t null - failed\n",0x28);
  }
  pjVar2 = argo::json::operator[](&jStack_118,"b");
  argo::json::operator=(pjVar2,1);
  pjVar2 = argo::json::operator[](&jStack_118,"c");
  argo::json::operator=(pjVar2,1.1);
  pjVar2 = argo::json::operator[](&jStack_118,"d");
  argo::json::operator=(pjVar2,"asdf");
  pjVar2 = argo::json::operator[](&jStack_118,"e");
  argo::json::operator=(pjVar2,true);
  test_square_brackets_const_object(&jStack_118);
  pjVar2 = argo::json::operator[](&jStack_118,"b");
  bVar1 = argo::json::operator!=(pjVar2,1);
  if (!bVar1) {
    pjVar2 = argo::json::operator[](&jStack_118,"c");
    bVar1 = argo::json::operator!=(pjVar2,1.1);
    if (!bVar1) {
      pjVar2 = argo::json::operator[](&jStack_118,"d");
      bVar1 = argo::json::operator!=(pjVar2,"asdf");
      if (!bVar1) {
        pjVar2 = argo::json::operator[](&jStack_118,"e");
        bVar1 = argo::json::operator_cast_to_bool(pjVar2);
        if (bVar1) goto LAB_0010fcc0;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: object access failed\n",0x1b);
LAB_0010fcc0:
  argo::json::~json(&jStack_118);
  argo::json::~json(&local_c0);
  return;
}

Assistant:

void test_square_brackets()
{
    json a(json::array_e);
    a.append(10);
    a.append(20.0);
    a.append("asdf");
    a.append(true);

    test_square_brackets_const_array(a);

    if ((a[0] != 10) ||
        (a[1] != 20.0) ||
        (a[2] != "asdf") ||
         !a[3])
    {
        jlog << "FAIL: array access failed\n";
    }

    json o(json::object_e);
    if (o["a"] != json())
    {
        jlog << "FAIL: empty element isn't null - failed\n";
    }
    o["b"] = 1;
    o["c"] = 1.1;
    o["d"] = "asdf";
    o["e"] = true;

    test_square_brackets_const_object(o);

    if ((o["b"] != 1) ||
        (o["c"] != 1.1) ||
        (o["d"] != "asdf") ||
        !o["e"])
    {
        jlog << "FAIL: object access failed\n";
    }
}